

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinit.c
# Opt level: O1

void init_Xevent(DspInterface dsp)

{
  XSelectInput(dsp->display_id,dsp->LispWindow,dsp->EnableEventMask);
  XSelectInput(dsp->display_id,dsp->DisplayWindow,dsp->EnableEventMask);
  if (noscroll != 0) {
    return;
  }
  XSelectInput(dsp->display_id,dsp->HorScrollBar,0x2003c);
  XSelectInput(dsp->display_id,dsp->VerScrollBar,0x2003c);
  XSelectInput(dsp->display_id,dsp->HorScrollButton,0);
  XSelectInput(dsp->display_id,dsp->VerScrollButton,0);
  XSelectInput(dsp->display_id,dsp->NEGrav,0x2003c);
  XSelectInput(dsp->display_id,dsp->SEGrav,0x2003c);
  XSelectInput(dsp->display_id,dsp->SWGrav,0x2003c);
  XSelectInput(dsp->display_id,dsp->NWGrav,0x2003c);
  return;
}

Assistant:

void init_Xevent(DspInterface dsp)
{
  int GravMask, BarMask;

  GravMask =
      ButtonPressMask | ButtonReleaseMask | EnterWindowMask | LeaveWindowMask | StructureNotifyMask;
  BarMask = GravMask;

  XSelectInput(dsp->display_id, dsp->LispWindow, dsp->EnableEventMask);
  XSelectInput(dsp->display_id, dsp->DisplayWindow, dsp->EnableEventMask);
  if (noscroll == 0) {
    XSelectInput(dsp->display_id, dsp->HorScrollBar, BarMask);
    XSelectInput(dsp->display_id, dsp->VerScrollBar, BarMask);
    XSelectInput(dsp->display_id, dsp->HorScrollButton, NoEventMask);
    XSelectInput(dsp->display_id, dsp->VerScrollButton, NoEventMask);
    XSelectInput(dsp->display_id, dsp->NEGrav, GravMask);
    XSelectInput(dsp->display_id, dsp->SEGrav, GravMask);
    XSelectInput(dsp->display_id, dsp->SWGrav, GravMask);
    XSelectInput(dsp->display_id, dsp->NWGrav, GravMask);
  }
}